

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryConflictsWithEnum_Test::TestBody
          (ValidationErrorTest_MapEntryConflictsWithEnum_Test *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar1;
  Message *in_RCX;
  string_view input;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  FileDescriptorProto file_proto;
  
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  anon_unknown_532::FillValidMapEntry(&file_proto);
  pVVar1 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&file_proto.field_0._impl_.message_type_.super_RepeatedPtrFieldBase,0);
  input._M_str = (char *)pVVar1;
  input._M_len = (size_t)
                 "enum_type {   name: \'FooMapEntry\'   value { name: \'ENTRY_FOO\' number: 0 }}";
  TextFormat::MergeFromString((TextFormat *)0x4a,input,in_RCX);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120,
            "foo.proto: Foo.FooMapEntry: NAME: \"FooMapEntry\" is already defined in \"Foo\".\nfoo.proto: Foo: NAME: Expanded map entry type FooMapEntry conflicts with an existing enum type.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&file_proto,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_120);
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryConflictsWithEnum) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  TextFormat::MergeFromString(
      "enum_type { "
      "  name: 'FooMapEntry' "
      "  value { name: 'ENTRY_FOO' number: 0 }"
      "}",
      file_proto.mutable_message_type(0));
  BuildFileWithErrors(
      file_proto,
      "foo.proto: Foo.FooMapEntry: NAME: \"FooMapEntry\" is already defined in "
      "\"Foo\".\n"
      "foo.proto: Foo: NAME: Expanded map entry type FooMapEntry conflicts "
      "with an existing enum type.\n");
}